

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttyio.c
# Opt level: O2

void ttflush(void)

{
  int __fd;
  size_t sVar1;
  int *piVar2;
  char *__buf;
  
  if ((nobuf != 0) && (batch != 1)) {
    __buf = obuf;
    while( true ) {
      __fd = fileno(_stdout);
      sVar1 = write(__fd,__buf,nobuf);
      if (sVar1 == nobuf) break;
      if (sVar1 == 0xffffffffffffffff) {
        piVar2 = __errno_location();
        if (*piVar2 != 4) {
          panic("ttflush write failed");
        }
      }
      else {
        __buf = __buf + sVar1;
        nobuf = nobuf - sVar1;
      }
    }
    nobuf = 0;
  }
  return;
}

Assistant:

void
ttflush(void)
{
	ssize_t	 written;
	char	*buf = obuf;

	if (nobuf == 0 || batch == 1)
		return;

	while ((written = write(fileno(stdout), buf, nobuf)) != nobuf) {
		if (written == -1) {
			if (errno == EINTR)
				continue;
			panic("ttflush write failed");
		}
		buf += written;
		nobuf -= written;
	}
	nobuf = 0;
}